

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

void finish_output_gif(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  int iVar1;
  long in_RSI;
  long *in_RDI;
  gif_dest_ptr dest;
  
  compress_term((gif_dest_ptr)0x105c70);
  putc(0,*(FILE **)(in_RSI + 0x20));
  putc(0x3b,*(FILE **)(in_RSI + 0x20));
  fflush(*(FILE **)(in_RSI + 0x20));
  iVar1 = ferror(*(FILE **)(in_RSI + 0x20));
  if (iVar1 != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  return;
}

Assistant:

METHODDEF(void)
finish_output_gif(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  gif_dest_ptr dest = (gif_dest_ptr)dinfo;

  /* Flush compression mechanism */
  compress_term(dest);
  /* Write a zero-length data block to end the series */
  putc(0, dest->pub.output_file);
  /* Write the GIF terminator mark */
  putc(';', dest->pub.output_file);
  /* Make sure we wrote the output file OK */
  fflush(dest->pub.output_file);
  if (ferror(dest->pub.output_file))
    ERREXIT(cinfo, JERR_FILE_WRITE);
}